

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

double llvm::detail::frexp(double __x,int *__exponent)

{
  int iVar1;
  int *in_RDX;
  IEEEFloat *in_RSI;
  double extraout_XMM0_Qa;
  double __x_00;
  double extraout_XMM0_Qa_00;
  double dVar2;
  IEEEFloat local_40;
  
  iVar1 = ilogb(__x);
  *in_RDX = iVar1;
  if (iVar1 == 0x7fffffff) {
    IEEEFloat::IEEEFloat((IEEEFloat *)__exponent,in_RSI);
    dVar2 = extraout_XMM0_Qa;
  }
  else {
    if (iVar1 == -0x7fffffff) {
      iVar1 = 0;
    }
    else {
      iVar1 = iVar1 + 1;
    }
    *in_RDX = iVar1;
    IEEEFloat::IEEEFloat(&local_40,in_RSI);
    scalbn(__x_00,(int)__exponent);
    IEEEFloat::~IEEEFloat(&local_40);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

IEEEFloat frexp(const IEEEFloat &Val, int &Exp, IEEEFloat::roundingMode RM) {
  Exp = ilogb(Val);

  // Quiet signalling nans.
  if (Exp == IEEEFloat::IEK_NaN) {
    IEEEFloat Quiet(Val);
    Quiet.makeQuiet();
    return Quiet;
  }

  if (Exp == IEEEFloat::IEK_Inf)
    return Val;

  // 1 is added because frexp is defined to return a normalized fraction in
  // +/-[0.5, 1.0), rather than the usual +/-[1.0, 2.0).
  Exp = Exp == IEEEFloat::IEK_Zero ? 0 : Exp + 1;
  return scalbn(Val, -Exp, RM);
}